

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O1

void __thiscall HACD::TMMTriangle::Initialize(TMMTriangle *this)

{
  long lVar1;
  
  this->m_id = 0;
  this->m_edges[0] = (CircularListElement<HACD::TMMEdge> *)0x0;
  this->m_edges[1] = (CircularListElement<HACD::TMMEdge> *)0x0;
  this->m_edges[2] = (CircularListElement<HACD::TMMEdge> *)0x0;
  this->m_vertices[0] = (CircularListElement<HACD::TMMVertex> *)0x0;
  lVar1 = 3;
  do {
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  this->m_visible = false;
  (this->m_incidentPoints).m_data = (long *)SUB168(ZEXT416(0) << 0x40,0);
  (this->m_incidentPoints).m_size = SUB168(ZEXT416(0) << 0x40,8);
  (this->m_incidentPoints).m_maxSize = 0x10;
  return;
}

Assistant:

void TMMTriangle::Initialize()
	{
        m_id = 0;
		for(int i = 0; i < 3; i++)
		{
			m_edges[i] = 0;
			m_vertices[0] = 0;
		}
		m_visible = false;
        m_incidentPoints.Initialize();
    }